

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall solitaire::graphics::Renderer::renderStockPile(Renderer *this)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  Cards *pileCards;
  SelectedCardIndex local_20;
  
  iVar1 = (*this->context->_vptr_Context[5])();
  plVar2 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x78))
                             ((long *)CONCAT44(extraout_var,iVar1));
  pileCards = (Cards *)(**(code **)(*plVar2 + 0x30))(plVar2);
  local_20.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(**(code **)(*plVar2 + 0x38))(plVar2);
  if ((pileCards->
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (pileCards->
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    renderStockPileWithCards(this,pileCards,&local_20);
    return;
  }
  renderCardPlaceholder(this,&Layout::stockPilePosition);
  return;
}

Assistant:

void Renderer::renderStockPile() const {
    const auto& pile = context.getSolitaire().getStockPile();
    const auto& pileCards = pile.getCards();
    const auto& selectedCardIndex = pile.getSelectedCardIndex();

    if (pileCards.empty())
        renderCardPlaceholder(Layout::stockPilePosition);
    else renderStockPileWithCards(pileCards, selectedCardIndex);
}